

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

void __thiscall FSerializer::EndArray(FSerializer *this)

{
  bool bVar1;
  FSerializer *this_local;
  
  bVar1 = isWriting(this);
  if (bVar1) {
    bVar1 = FWriter::inObject(this->w);
    if (bVar1) {
      __assert_fail("false && \"EndArray call not inside an array\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x2b0,"void FSerializer::EndArray()");
    }
    FWriter::EndArray(this->w);
    TArray<bool,_bool>::Pop(&this->w->mInObject);
  }
  else {
    TArray<FJSONObject,_FJSONObject>::Pop(&this->r->mObjects);
  }
  return;
}

Assistant:

void FSerializer::EndArray()
{
	if (isWriting())
	{
		if (!w->inObject())
		{
			w->EndArray();
			w->mInObject.Pop();
		}
		else
		{
			assert(false && "EndArray call not inside an array");
			I_Error("EndArray call not inside an array");
		}
	}
	else
	{
		r->mObjects.Pop();
	}
}